

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void MyDocument::DisplayContents(MyDocument *doc)

{
  bool bVar1;
  MyDocument *in_RDI;
  void *unaff_retaddr;
  ImVec4 *in_stack_00000008;
  ImVec2 in_stack_ffffffffffffffe8;
  float in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  
  ImGui::PushID(unaff_retaddr);
  ImGui::Text("Document \"%s\"",in_RDI->Name);
  ImGui::PushStyleColor(doc._4_4_,in_stack_00000008);
  ImGui::TextWrapped(
                    "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
                    );
  ImGui::PopStyleColor((int)in_stack_fffffffffffffff4);
  ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffff0,100.0,0.0);
  bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                        (ImVec2 *)in_stack_ffffffffffffffe8);
  if (bVar1) {
    in_RDI->Dirty = true;
  }
  ImGui::SameLine(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe8,100.0,0.0);
  bVar1 = ImGui::Button((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                        (ImVec2 *)in_stack_ffffffffffffffe8);
  if (bVar1) {
    DoSave(in_RDI);
  }
  ImGui::ColorEdit3((char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                    (float *)in_stack_ffffffffffffffe8,0);
  ImGui::PopID();
  return;
}

Assistant:

static void DisplayContents(MyDocument* doc)
    {
        ImGui::PushID(doc);
        ImGui::Text("Document \"%s\"", doc->Name);
        ImGui::PushStyleColor(ImGuiCol_Text, doc->Color);
        ImGui::TextWrapped("Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua.");
        ImGui::PopStyleColor();
        if (ImGui::Button("Modify", ImVec2(100, 0)))
            doc->Dirty = true;
        ImGui::SameLine();
        if (ImGui::Button("Save", ImVec2(100, 0)))
            doc->DoSave();
        ImGui::ColorEdit3("color", &doc->Color.x);  // Useful to test drag and drop and hold-dragged-to-open-tab behavior.
        ImGui::PopID();
    }